

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

DirHandle * getRealDirHandle(char *_fname)

{
  DirHandle *h;
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  long lVar7;
  void **retval;
  long *plVar8;
  __PHYSFS_DIRHANDLE__ *h_00;
  char *dst;
  long lStack_68;
  undefined1 local_60 [8];
  PHYSFS_Stat statbuf;
  char *arcfname;
  
  plVar8 = &lStack_68;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
LAB_00108b73:
    h_00 = (DirHandle *)0x0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    sVar5 = strlen(_fname);
    if (sVar5 + longest_root + 1 < 0x100) {
      plVar6 = (long *)((long)&lStack_68 - (longest_root + sVar5 + 0x18 & 0xfffffffffffffff0));
      lVar7 = 0;
      plVar8 = plVar6;
    }
    else {
      plVar6 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar5 + 9);
      if (plVar6 == (long *)0x0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        __PHYSFS_platformReleaseMutex(stateLock);
        goto LAB_00108b73;
      }
      lVar7 = 1;
    }
    *plVar6 = lVar7;
    dst = (char *)((long)plVar6 + longest_root + 8);
    plVar8[-1] = 0x108adc;
    iVar4 = sanitizePlatformIndependentPath(_fname,dst);
    if (searchPath != (DirHandle *)0x0 && iVar4 != 0) {
      h_00 = searchPath;
      do {
        h = (DirHandle *)h_00->mountPoint;
        statbuf._32_8_ = dst;
        plVar8[-1] = 0x108b0a;
        iVar4 = partOfMountPoint(h,dst);
        if (iVar4 != 0) goto LAB_00108b40;
        plVar8[-1] = 0x108b1b;
        iVar4 = verifyPath(h_00,(char **)&statbuf.filetype,0);
        uVar3 = statbuf._32_8_;
        if (iVar4 != 0) {
          pvVar1 = h_00->opaque;
          p_Var2 = h_00->funcs->stat;
          plVar8[-1] = 0x108b30;
          iVar4 = (*p_Var2)(pvVar1,(char *)uVar3,(PHYSFS_Stat *)local_60);
          if (iVar4 != 0) goto LAB_00108b40;
        }
        h_00 = h_00->next;
      } while (h_00 != (__PHYSFS_DIRHANDLE__ *)0x0);
    }
    h_00 = (DirHandle *)0x0;
LAB_00108b40:
    plVar8[-1] = 0x108b4c;
    __PHYSFS_platformReleaseMutex(stateLock);
    if (*plVar6 != 0) {
      plVar8[-1] = 0x108b5b;
      (*__PHYSFS_AllocatorHooks.Free)(plVar6);
    }
  }
  return h_00;
}

Assistant:

static DirHandle *getRealDirHandle(const char *_fname)
{
    DirHandle *retval = NULL;
    char *allocated_fname = NULL;
    char *fname = NULL;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, NULL);

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, NULL);
    fname = allocated_fname + longest_root;
    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        DirHandle *i;
        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (partOfMountPoint(i, arcfname))
            {
                retval = i;
                break;
            } /* if */
            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    retval = i;
                    break;
                } /* if */
            } /* if */
        } /* for */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return retval;
}